

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
CEDate::Gregorian2GregorianVect
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,double gregorian)

{
  double dVar1;
  reference pvVar2;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  allocator<double> local_61;
  double local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  value_type local_38;
  undefined8 uStack_30;
  value_type_conflict local_20;
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = gregorian;
  local_48._12_4_ = in_XMM0_Dd;
  local_20 = 0.0;
  std::allocator<double>::allocator(&local_61);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,4,&local_20,&local_61)
  ;
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_61);
  local_58._8_4_ = (int)(local_48._8_8_ & 0x7fffffffffffffff);
  local_58._0_8_ = ABS((double)local_48._0_8_);
  local_58._12_4_ = (int)((local_48._8_8_ & 0x7fffffffffffffff) >> 0x20);
  local_60 = floor(ABS((double)local_48._0_8_));
  local_38 = (double)local_58._0_8_ - local_60;
  uStack_30 = local_58._8_8_;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,3);
  *pvVar2 = local_38;
  local_60 = (double)((int)local_60 % 100);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  *pvVar2 = local_60;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  dVar1 = floor((double)local_58._0_8_ - *pvVar2);
  local_60 = (double)((int)(dVar1 / 100.0) % 100);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar2 = local_60;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  local_58._0_8_ = (double)local_58._0_8_ - *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  dVar1 = floor(*pvVar2 * -100.0 + (double)local_58._0_8_);
  local_58._8_4_ = SUB84((double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc),0);
  local_58._0_8_ = (double)(int)(dVar1 / 10000.0);
  local_58._12_4_ =
       (int)((ulong)(double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) >> 0x20);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar2 = (value_type)local_58._0_8_;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar2 = (value_type)
            (-(ulong)((double)local_48._0_8_ < 0.0) & (ulong)-*pvVar2 |
            ~-(ulong)((double)local_48._0_8_ < 0.0) & (ulong)*pvVar2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CEDate::Gregorian2GregorianVect(double gregorian)
{
    // Create a vector to hold the information
    std::vector<double> gregorian_vect(4,0.0) ;
    double greg = std::fabs(gregorian);

    // Get the day fraction
    gregorian_vect[3] = greg - std::floor(greg);
    // Get the day of the month
    gregorian_vect[2] = int(std::floor(greg)) % 100 ;
    // Get the month
    gregorian_vect[1] = int(std::floor(greg - gregorian_vect[2])/100) % 100;
    // Get the year
    gregorian_vect[0] = int(std::floor(greg - gregorian_vect[2] - 100*gregorian_vect[1]) / 10000);
    gregorian_vect[0] *= (gregorian < 0.0) ? -1.0 : 1.0;

    return gregorian_vect;
}